

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.c
# Opt level: O0

int simplify_branch_branch(dmr_C *C,basic_block *bb,instruction *br,basic_block **target_p,int true)

{
  basic_block *bb_00;
  int iVar1;
  instruction *jmp;
  basic_block *local_60;
  int retval;
  instruction *insn;
  basic_block *final;
  basic_block *target;
  int true_local;
  basic_block **target_p_local;
  instruction *br_local;
  basic_block *bb_local;
  dmr_C *C_local;
  
  bb_00 = *target_p;
  if (bb_00 == bb) {
    C_local._4_4_ = 0;
  }
  else {
    jmp = dmrC_last_instruction(bb_00->insns);
    if (((jmp == (instruction *)0x0) ||
        (((undefined1  [64])*jmp & (undefined1  [64])0xff) != (undefined1  [64])0x4)) ||
       ((jmp->field_5).target != (br->field_5).target)) {
      C_local._4_4_ = 0;
    }
    else {
      if (true == 0) {
        local_60 = (jmp->field_6).field_1.bb_false;
      }
      else {
        local_60 = (jmp->field_6).field_1.bb_true;
      }
      iVar1 = bb_has_side_effects(bb_00);
      if ((iVar1 == 0) && (iVar1 = bb_depends_on(local_60,bb_00), iVar1 == 0)) {
        iVar1 = bb_depends_on_phi(local_60,bb_00);
        if (iVar1 == 0) {
          C_local._4_4_ = rewrite_branch(C,bb,target_p,bb_00,local_60);
        }
        else {
          C_local._4_4_ = 0;
        }
      }
      else {
        iVar1 = dmrC_bb_list_size(bb_00->parents);
        if (iVar1 == 1) {
          dmrC_insert_branch(C,bb_00,jmp,local_60);
          C_local._4_4_ = 1;
        }
        else {
          C_local._4_4_ = 0;
        }
      }
    }
  }
  return C_local._4_4_;
}

Assistant:

static int simplify_branch_branch(struct dmr_C *C, struct basic_block *bb, struct instruction *br,
	struct basic_block **target_p, int true)
{
	struct basic_block *target = *target_p, *final;
	struct instruction *insn;
	int retval;

	if (target == bb)
		return 0;
	insn = dmrC_last_instruction(target->insns);
	if (!insn || insn->opcode != OP_CBR || insn->cond != br->cond)
		return 0;
	/*
	 * Ahhah! We've found a branch to a branch on the same conditional!
	 * Now we just need to see if we can rewrite the branch..
	 */
	retval = 0;
	final = true ? insn->bb_true : insn->bb_false;
	if (bb_has_side_effects(target))
		goto try_to_rewrite_target;
	if (bb_depends_on(final, target))
		goto try_to_rewrite_target;
	if (bb_depends_on_phi(final, target))
		return 0;
	return rewrite_branch(C, bb, target_p, target, final);

try_to_rewrite_target:
	/*
	 * If we're the only parent, at least we can rewrite the
	 * now-known second branch.
	 */
	if (dmrC_bb_list_size(target->parents) != 1)
		return retval;
	dmrC_insert_branch(C, target, insn, final);
	return 1;
}